

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

uint * __thiscall
Lib::Map<Kernel::Variable,_unsigned_int,_Lib::StlHash>::insert
          (Map<Kernel::Variable,_unsigned_int,_Lib::StlHash> *this,Variable *key,uint *val,uint code
          )

{
  MaybeUninit<unsigned_int> MVar1;
  Entry *pEVar2;
  uint uVar3;
  
  pEVar2 = this->_entries + (ulong)code % (ulong)(uint)this->_capacity;
  uVar3 = pEVar2->code;
  if (uVar3 != 0) {
    do {
      if ((uVar3 == code) && (pEVar2->_key == (MaybeUninit<Kernel::Variable>)key->_num)) {
        return (uint *)&pEVar2->_value;
      }
      pEVar2 = pEVar2 + 1;
      if (pEVar2 == this->_afterLast) {
        pEVar2 = this->_entries;
      }
      uVar3 = pEVar2->code;
    } while (uVar3 != 0);
  }
  this->_noOfEntries = this->_noOfEntries + 1;
  MVar1 = (MaybeUninit<unsigned_int>)*val;
  (pEVar2->_key).__align = (anon_struct_4_0_00000001_for___align)key->_num;
  pEVar2->_value = MVar1;
  pEVar2->code = code;
  return (uint *)&pEVar2->_value;
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }